

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O2

ASkyViewpoint * __thiscall TActorIterator<ASkyViewpoint>::Next(TActorIterator<ASkyViewpoint> *this)

{
  bool bVar1;
  AActor *this_00;
  
  do {
    this_00 = FActorIterator::Next(&this->super_FActorIterator);
    if (this_00 == (AActor *)0x0) {
      return (ASkyViewpoint *)0x0;
    }
    bVar1 = DObject::IsKindOf((DObject *)this_00,ASkyViewpoint::RegistrationInfo.MyClass);
  } while (!bVar1);
  return (ASkyViewpoint *)this_00;
}

Assistant:

T *Next ()
	{
		AActor *actor;
		do
		{
			actor = FActorIterator::Next ();
		} while (actor && !actor->IsKindOf (RUNTIME_TEMPLATE_CLASS(T)));
		return static_cast<T *>(actor);
	}